

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_product_type_init(parser_info *info,char **attr)

{
  char *name_00;
  coda_product_type *pcVar1;
  char *name;
  char **attr_local;
  parser_info *info_local;
  
  name_00 = get_mandatory_attribute_value(attr,"name",info->node->tag);
  if (name_00 == (char *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    info->node->free_data = coda_product_type_delete;
    pcVar1 = coda_product_type_new(name_00);
    info->node->data = pcVar1;
    if (info->node->data == (void *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      register_sub_element
                (info->node,element_cd_description,string_data_init,cd_product_type_set_description)
      ;
      register_sub_element
                (info->node,element_cd_product_definition,cd_product_definition_init,
                 cd_product_type_add_product_definition);
      info_local._4_4_ = 0;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_product_type_init(parser_info *info, const char **attr)
{
    const char *name;

    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_product_type_delete;
    info->node->data = coda_product_type_new(name);
    if (info->node->data == NULL)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_type_set_description);
    register_sub_element(info->node, element_cd_product_definition, cd_product_definition_init,
                         cd_product_type_add_product_definition);

    return 0;
}